

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Define.h
# Opt level: O0

Unique<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>_> __thiscall
anurbs::
new_<anurbs::Entry<anurbs::NurbsCurveGeometry<3l>>,std::__cxx11::string&,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>&,std::shared_ptr<anurbs::Attributes>&>
          (anurbs *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          shared_ptr<anurbs::NurbsCurveGeometry<3L>_> *args_1,shared_ptr<anurbs::Attributes> *args_2
          )

{
  shared_ptr<anurbs::NurbsCurveGeometry<3L>_> *key;
  Entry<anurbs::NurbsCurveGeometry<3L>_> *this_00;
  shared_ptr<anurbs::Attributes> local_48;
  shared_ptr<anurbs::NurbsCurveGeometry<3L>_> local_38;
  shared_ptr<anurbs::Attributes> *local_28;
  shared_ptr<anurbs::Attributes> *args_local_2;
  shared_ptr<anurbs::NurbsCurveGeometry<3L>_> *args_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  
  local_28 = args_2;
  args_local_2 = (shared_ptr<anurbs::Attributes> *)args_1;
  args_local_1 = (shared_ptr<anurbs::NurbsCurveGeometry<3L>_> *)args;
  args_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  this_00 = (Entry<anurbs::NurbsCurveGeometry<3L>_> *)operator_new(0x48);
  key = args_local_1;
  std::shared_ptr<anurbs::NurbsCurveGeometry<3L>_>::shared_ptr
            (&local_38,(shared_ptr<anurbs::NurbsCurveGeometry<3L>_> *)args_local_2);
  std::shared_ptr<anurbs::Attributes>::shared_ptr(&local_48,local_28);
  Entry<anurbs::NurbsCurveGeometry<3L>_>::Entry(this_00,(string *)key,&local_38,&local_48);
  std::
  unique_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<3l>>,std::default_delete<anurbs::Entry<anurbs::NurbsCurveGeometry<3l>>>>
  ::unique_ptr<std::default_delete<anurbs::Entry<anurbs::NurbsCurveGeometry<3l>>>,void>
            ((unique_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<3l>>,std::default_delete<anurbs::Entry<anurbs::NurbsCurveGeometry<3l>>>>
              *)this,this_00);
  std::shared_ptr<anurbs::Attributes>::~shared_ptr(&local_48);
  std::shared_ptr<anurbs::NurbsCurveGeometry<3L>_>::~shared_ptr(&local_38);
  return (__uniq_ptr_data<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>,_std::default_delete<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>_>,_true,_true>
          )(__uniq_ptr_data<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>,_std::default_delete<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>_>,_true,_true>
            )this;
}

Assistant:

Unique<T> new_(TArgs&&... args)
{
    return Unique<T>(new T(std::forward<TArgs>(args)...));
}